

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CommissionerApp::SetPanId
          (Error *__return_storage_ptr__,CommissionerApp *this,uint16_t aPanId,MilliSeconds aDelay)

{
  ErrorCode EVar1;
  int iVar2;
  Error *pEVar3;
  char *begin;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  string sStack_178;
  undefined1 local_158 [8];
  _Alloc_hider local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  parse_func local_130 [1];
  undefined1 local_128 [40];
  PendingOperationalDataset local_100;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  PendingOperationalDataset::PendingOperationalDataset(&local_100);
  iVar2 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])(this);
  if ((char)iVar2 == '\0') {
    local_158._0_4_ = none_type;
    local_150._M_p = "the commissioner is not active";
    local_148 = 0x1e;
    local_140._M_allocated_capacity = 0;
    local_130[0] = (parse_func)0x0;
    pcVar4 = "the commissioner is not active";
    local_140._8_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_158;
    while (begin = pcVar4, begin != "") {
      pcVar4 = begin + 1;
      if (*begin == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_158);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_158;
    ::fmt::v10::vformat_abi_cxx11_(&sStack_178,(v10 *)0x2157e0,(string_view)ZEXT816(0x1e),args);
    local_128._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)(local_128 + 8),(string *)&sStack_178);
    Error::operator=(__return_storage_ptr__,(Error *)local_128);
    std::__cxx11::string::~string((string *)(local_128 + 8));
    std::__cxx11::string::~string((string *)&sStack_178);
  }
  else {
    local_100.super_ActiveOperationalDataset._212_4_ = SUB84(aDelay.__r,0);
    local_100.super_ActiveOperationalDataset.mPresentFlags =
         local_100.super_ActiveOperationalDataset.mPresentFlags | 0x120;
    local_100.super_ActiveOperationalDataset.mPanId = aPanId;
    (*((this->mCommissioner).
       super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_Commissioner[0x22])(local_158);
    pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_158);
    EVar1 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)&local_150);
    if (EVar1 == kNone) {
      MergeDataset(&this->mPendingDataset,&local_100);
    }
  }
  ActiveOperationalDataset::~ActiveOperationalDataset(&local_100.super_ActiveOperationalDataset);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::SetPanId(uint16_t aPanId, MilliSeconds aDelay)
{
    Error                     error;
    PendingOperationalDataset pendingDataset;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    pendingDataset.mPanId = aPanId;
    pendingDataset.mPresentFlags |= PendingOperationalDataset::kPanIdBit;

    pendingDataset.mDelayTimer = aDelay.count();
    pendingDataset.mPresentFlags |= PendingOperationalDataset::kDelayTimerBit;

    SuccessOrExit(error = mCommissioner->SetPendingDataset(pendingDataset));

    MergeDataset(mPendingDataset, pendingDataset);

exit:
    return error;
}